

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O1

btVector3 __thiscall btSliderConstraint::getAncorInA(btSliderConstraint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btVector3 bVar4;
  float local_48;
  float local_44;
  float local_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float local_28;
  float local_24;
  float local_20;
  float local_18;
  undefined8 local_14;
  
  fVar1 = (this->m_lowerLinLimit + this->m_upperLinLimit) * 0.5;
  fVar2 = (this->m_sliderAxis).m_floats[0] * fVar1 + (this->m_realPivotAInW).m_floats[0];
  fVar3 = (this->m_sliderAxis).m_floats[1] * fVar1 + (this->m_realPivotAInW).m_floats[1];
  fVar1 = fVar1 * (this->m_sliderAxis).m_floats[2] + (this->m_realPivotAInW).m_floats[2];
  btTransform::inverse
            (&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform);
  bVar4.m_floats[0] = local_40 * fVar1 + local_48 * fVar2 + local_44 * fVar3 + local_18;
  bVar4.m_floats[1] = (float)local_14 + fStack_30 * fVar1 + local_38 * fVar2 + fStack_34 * fVar3;
  bVar4.m_floats[2] =
       (float)((ulong)local_14 >> 0x20) + local_20 * fVar1 + local_28 * fVar2 + local_24 * fVar3;
  bVar4.m_floats[3] = 0.0;
  return (btVector3)bVar4.m_floats;
}

Assistant:

btVector3 btSliderConstraint::getAncorInA(void)
{
	btVector3 ancorInA;
	ancorInA = m_realPivotAInW + (m_lowerLinLimit + m_upperLinLimit) * btScalar(0.5) * m_sliderAxis;
	ancorInA = m_rbA.getCenterOfMassTransform().inverse() * ancorInA;
	return ancorInA;
}